

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_goiffalse(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int l2;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  l2 = -1;
  if ((eVar1 != VNIL) && (eVar1 != VFALSE)) {
    if (eVar1 == VJMP) {
      l2 = (e->u).info;
    }
    else {
      l2 = jumponcond(fs,e,1);
    }
  }
  luaK_concat(fs,&e->t,l2);
  luaK_patchtohere(fs,e->f);
  e->f = -1;
  return;
}

Assistant:

void luaK_goiffalse (FuncState *fs, expdesc *e) {
  int pc;  /* pc of new jump */
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VJMP: {
      pc = e->u.info;  /* already jump if true */
      break;
    }
    case VNIL: case VFALSE: {
      pc = NO_JUMP;  /* always false; do nothing */
      break;
    }
    default: {
      pc = jumponcond(fs, e, 1);  /* jump if true */
      break;
    }
  }
  luaK_concat(fs, &e->t, pc);  /* insert new jump in 't' list */
  luaK_patchtohere(fs, e->f);  /* false list jumps to here (to go through) */
  e->f = NO_JUMP;
}